

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynbuf.c
# Opt level: O3

CURLcode dyn_nappend(dynbuf *s,uchar *mem,size_t len)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  CURLcode CVar4;
  char *pcVar5;
  ulong uVar6;
  size_t sVar7;
  
  sVar1 = s->leng;
  uVar6 = len + sVar1 + 1;
  if (s->toobig < uVar6) {
LAB_00116ac8:
    (*Curl_cfree)(s->bufr);
    s->bufr = (char *)0x0;
    s->leng = 0;
    s->allc = 0;
    CVar4 = CURLE_OUT_OF_MEMORY;
  }
  else {
    uVar2 = s->allc;
    uVar3 = uVar2;
    if (uVar2 == 0) {
      sVar7 = 0x20;
      if (0x20 < uVar6) {
        sVar7 = uVar6;
      }
    }
    else {
      do {
        sVar7 = uVar3;
        uVar3 = sVar7 * 2;
      } while (sVar7 < uVar6);
    }
    pcVar5 = s->bufr;
    if (sVar7 != uVar2) {
      pcVar5 = (char *)(*Curl_crealloc)(pcVar5,sVar7);
      if (pcVar5 == (char *)0x0) goto LAB_00116ac8;
      s->bufr = pcVar5;
      s->allc = sVar7;
    }
    if (len != 0) {
      memcpy(pcVar5 + sVar1,mem,len);
      pcVar5 = s->bufr;
    }
    s->leng = len + sVar1;
    pcVar5[len + sVar1] = '\0';
    CVar4 = CURLE_OK;
  }
  return CVar4;
}

Assistant:

static CURLcode dyn_nappend(struct dynbuf *s,
                            const unsigned char *mem, size_t len)
{
  size_t indx = s->leng;
  size_t a = s->allc;
  size_t fit = len + indx + 1; /* new string + old string + zero byte */

  /* try to detect if there's rubbish in the struct */
  DEBUGASSERT(s->init == DYNINIT);
  DEBUGASSERT(s->toobig);
  DEBUGASSERT(indx < s->toobig);
  DEBUGASSERT(!s->leng || s->bufr);

  if(fit > s->toobig) {
    Curl_dyn_free(s);
    return CURLE_OUT_OF_MEMORY;
  }
  else if(!a) {
    DEBUGASSERT(!indx);
    /* first invoke */
    if(fit < MIN_FIRST_ALLOC)
      a = MIN_FIRST_ALLOC;
    else
      a = fit;
  }
  else {
    while(a < fit)
      a *= 2;
  }

  if(a != s->allc) {
    /* this logic is not using Curl_saferealloc() to make the tool not have to
       include that as well when it uses this code */
    void *p = realloc(s->bufr, a);
    if(!p) {
      Curl_safefree(s->bufr);
      s->leng = s->allc = 0;
      return CURLE_OUT_OF_MEMORY;
    }
    s->bufr = p;
    s->allc = a;
  }

  if(len)
    memcpy(&s->bufr[indx], mem, len);
  s->leng = indx + len;
  s->bufr[s->leng] = 0;
  return CURLE_OK;
}